

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uv__io_s *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  uint64_t uVar10;
  uint uVar11;
  ulong uVar12;
  long *plVar13;
  uv__io_t *__event;
  sigset_t *__set;
  epoll_event e;
  sigset_t sigset;
  epoll_event events [1024];
  int local_30f0;
  int local_30e4;
  epoll_event local_30e0;
  uv__io_s *local_30d0;
  uint64_t local_30c8;
  sigset_t *local_30c0;
  sigset_t local_30b8;
  uv__io_t local_3038 [219];
  
  if (loop->nfds == 0) {
    if (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0xe0,"void uv__io_poll(uv_loop_t *, int)");
    }
  }
  else {
    local_30e0.data.fd = 0;
    local_30e0.events = 0;
    local_30e0._4_4_ = 0;
    ppvVar1 = loop->watcher_queue;
    plVar13 = (long *)loop->watcher_queue[0];
    if (ppvVar1 != (void **)plVar13) {
      do {
        lVar4 = *plVar13;
        *(long *)plVar13[1] = lVar4;
        *(long *)(lVar4 + 8) = plVar13[1];
        *plVar13 = (long)plVar13;
        plVar13[1] = (long)plVar13;
        if (*(uint32_t *)(plVar13 + 2) == 0) {
          __assert_fail("w->pevents != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xec,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar7 = (int)plVar13[3];
        if (iVar7 < 0) {
          __assert_fail("w->fd >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xed,"void uv__io_poll(uv_loop_t *, int)");
        }
        if ((int)loop->nwatchers <= iVar7) {
          __assert_fail("w->fd < (int) loop->nwatchers",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xee,"void uv__io_poll(uv_loop_t *, int)");
        }
        local_30e0._4_4_ = iVar7;
        local_30e0.events = *(uint32_t *)(plVar13 + 2);
        iVar2 = *(int *)((long)plVar13 + 0x14);
        iVar7 = epoll_ctl(loop->backend_fd,(uint)(iVar2 != 0) * 2 + 1,iVar7,&local_30e0);
        if (iVar7 != 0) {
          piVar9 = __errno_location();
          if (*piVar9 != 0x11) goto LAB_004cb048;
          if (iVar2 != 0) {
            __assert_fail("op == EPOLL_CTL_ADD",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0xff,"void uv__io_poll(uv_loop_t *, int)");
          }
          iVar7 = epoll_ctl(loop->backend_fd,3,(int)plVar13[3],&local_30e0);
          if (iVar7 != 0) goto LAB_004cb048;
        }
        *(int *)((long)plVar13 + 0x14) = (int)plVar13[2];
        plVar13 = (long *)*ppvVar1;
      } while (ppvVar1 != (void **)plVar13);
    }
    if ((loop->flags & 1) == 0) {
      __set = (sigset_t *)0x0;
    }
    else {
      __set = &local_30b8;
      sigemptyset(__set);
      sigaddset(__set,0x1b);
    }
    if (timeout < -1) {
      __assert_fail("timeout >= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x110,"void uv__io_poll(uv_loop_t *, int)");
    }
    local_30c8 = loop->time;
    local_30d0 = &loop->signal_io_watcher;
    local_30e4 = 0x30;
    local_30c0 = __set;
    local_30f0 = timeout;
LAB_004cadc7:
    do {
      while( true ) {
        uVar8 = epoll_pwait(loop->backend_fd,(epoll_event *)local_3038,0x400,timeout,__set);
        piVar9 = __errno_location();
        iVar7 = *piVar9;
        uVar10 = uv__hrtime(UV_CLOCK_FAST);
        uVar12 = uVar10 / 1000000;
        loop->time = uVar12;
        *piVar9 = iVar7;
        if (uVar8 != 0xffffffff) break;
        if (iVar7 != 4) {
LAB_004cb048:
          abort();
        }
        if (timeout != -1) {
          if (timeout == 0) {
            return;
          }
LAB_004caf9b:
          local_30f0 = local_30f0 + ((int)local_30c8 - (int)uVar12);
          timeout = local_30f0;
          if (local_30f0 < 1) {
            return;
          }
        }
      }
      if (uVar8 == 0) {
        if (timeout == 0) {
          return;
        }
        if (timeout == -1) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x129,"void uv__io_poll(uv_loop_t *, int)");
        }
        goto LAB_004caf9b;
      }
      __event = local_3038;
      if (loop->watchers == (uv__io_t **)0x0) {
        __assert_fail("loop->watchers != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x145,"void uv__io_poll(uv_loop_t *, int)");
      }
      uVar3 = loop->nwatchers;
      loop->watchers[uVar3] = __event;
      loop->watchers[uVar3 + 1] = (uv__io_t *)(long)(int)uVar8;
      if ((int)uVar8 < 1) {
        uVar8 = loop->nwatchers;
        loop->watchers[uVar8] = (uv__io_t *)0x0;
        loop->watchers[uVar8 + 1] = (uv__io_t *)0x0;
LAB_004caf58:
        if (timeout != -1) {
          if (timeout == 0) {
            return;
          }
          if (timeout < 1) {
            __assert_fail("timeout > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x19f,"void uv__io_poll(uv_loop_t *, int)");
          }
          uVar12 = loop->time;
          goto LAB_004caf9b;
        }
        goto LAB_004cadc7;
      }
      uVar12 = (ulong)uVar8;
      iVar7 = 0;
      bVar6 = false;
      do {
        uVar3 = *(uint *)((long)&__event->cb + 4);
        if ((ulong)uVar3 != 0xffffffff) {
          if ((int)uVar3 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x150,"void uv__io_poll(uv_loop_t *, int)");
          }
          if (loop->nwatchers <= uVar3) {
            __assert_fail("(unsigned) fd < loop->nwatchers",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x151,"void uv__io_poll(uv_loop_t *, int)");
          }
          puVar5 = loop->watchers[uVar3];
          if (puVar5 == (uv__io_s *)0x0) {
            epoll_ctl(loop->backend_fd,2,uVar3,(epoll_event *)__event);
          }
          else {
            uVar3 = puVar5->pevents;
            uVar11 = (uVar3 | 0x18) & *(uint *)&__event->cb;
            *(uint *)&__event->cb = uVar11;
            if (uVar11 != 0) {
              if ((uVar11 == 0x10) || (uVar11 == 8)) {
                uVar11 = uVar11 | uVar3 & 0x2007;
                *(uint *)&__event->cb = uVar11;
              }
              if (puVar5 == local_30d0) {
                bVar6 = true;
              }
              else {
                (*puVar5->cb)(loop,puVar5,uVar11);
              }
              iVar7 = iVar7 + 1;
            }
          }
        }
        __event = (uv__io_t *)((long)__event->pending_queue + 4);
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      if (bVar6) {
        (*(loop->signal_io_watcher).cb)(loop,local_30d0,1);
        uVar8 = loop->nwatchers;
        loop->watchers[uVar8] = (uv__io_t *)0x0;
        loop->watchers[uVar8 + 1] = (uv__io_t *)0x0;
        return;
      }
      uVar3 = loop->nwatchers;
      loop->watchers[uVar3] = (uv__io_t *)0x0;
      loop->watchers[uVar3 + 1] = (uv__io_t *)0x0;
      __set = local_30c0;
      if (iVar7 == 0) goto LAB_004caf58;
      if (uVar8 != 0x400) {
        return;
      }
      timeout = 0;
      local_30e4 = local_30e4 + -1;
    } while (local_30e4 != 0);
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  sigset_t* psigset;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  psigset = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    psigset = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  for (;;) {
    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    nfds = epoll_pwait(loop->backend_fd,
                       events,
                       ARRAY_SIZE(events),
                       timeout,
                       psigset);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno != EINTR)
        abort();

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    assert(loop->watchers != NULL);
    loop->watchers[loop->nwatchers] = (void*) events;
    loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher)
          have_signals = 1;
        else
          w->cb(loop, w, pe->events);

        nevents++;
      }
    }

    if (have_signals != 0)
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}